

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O3

bool node::LoadMempool(CTxMemPool *pool,path *load_path,Chainstate *active_chainstate,
                      ImportMempoolOptions *opts)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  element_type *peVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  bool bVar8;
  _IO_FILE *file_00;
  time_point tVar9;
  pointer __dest;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  undefined8 uVar12;
  ImportMempoolOptions *__nbytes;
  int __fd;
  size_t sVar13;
  long accept_time;
  int iVar14;
  iterator __end3;
  iterator __begin3;
  pointer pbVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  undefined8 in_stack_fffffffffffffd80;
  pointer in_stack_fffffffffffffd88;
  long lVar18;
  long local_270;
  long local_268;
  long local_260;
  CAmount amountdelta;
  CTransactionRef tx;
  int percentage_done;
  uint64_t txns_tried;
  uint64_t total_txns_to_load;
  vector<std::byte,_std::allocator<std::byte>_> local_208;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  int64_t unbroadcast;
  int64_t already_there;
  int64_t failed;
  int64_t expired;
  int64_t count;
  void *local_1a8;
  uint64_t uStack_1a0;
  uint64_t local_198;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  AutoFile file;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_c8 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_80;
  bool local_68;
  CFeeRate local_38;
  
  local_38.nSatoshisPerK = *(long *)(in_FS_OFFSET + 0x28);
  if ((load_path->super_path)._M_pathname._M_string_length == 0) {
    bVar8 = false;
  }
  else {
    mapDeltas._M_t._M_impl._0_8_ = anon_var_dwarf_3d7a18;
    if ((opts->mockable_fopen_function).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0026152b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38.nSatoshisPerK) {
        uVar12 = std::__throw_bad_function_call();
        AutoFile::~AutoFile(&file);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38.nSatoshisPerK) {
          _Unwind_Resume(uVar12);
        }
      }
      goto LAB_00261605;
    }
    __nbytes = opts;
    file_00 = (*(opts->mockable_fopen_function)._M_invoker)
                        ((_Any_data *)opts,load_path,(char **)&mapDeltas);
    local_1a8 = (void *)0x0;
    uStack_1a0 = 0;
    local_198 = 0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd80;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pool;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd88;
    AutoFile::AutoFile(&file,file_00,data_xor);
    if (local_1a8 != (void *)0x0) {
      operator_delete(local_1a8,local_198 - (long)local_1a8);
    }
    if (file.m_file != (FILE *)0x0) {
      count = 0;
      expired = 0;
      failed = 0;
      already_there = 0;
      unbroadcast = 0;
      tVar9 = NodeClock::now();
      AutoFile::read(&file,(int)&mapDeltas,&DAT_00000008,(size_t)__nbytes);
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (mapDeltas._M_t._M_impl._0_8_ == 1) {
        pbVar15 = (pointer)0x0;
      }
      else {
        if (mapDeltas._M_t._M_impl._0_8_ != 2) goto LAB_00261463;
        AutoFile::operator>>(&file,&xor_key);
        local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pbVar15 = xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                  -(long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start;
        if (pbVar15 != (pointer)0x0) {
          if (-1 < (long)pbVar15) {
            __dest = (pointer)operator_new((ulong)pbVar15);
            local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pbVar15 + (long)__dest;
            sVar13 = (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                           .super__Vector_impl_data._M_start;
            local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start = __dest;
            if (sVar13 != 0) {
              local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish = __dest;
              memmove(__dest,xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_start,sVar13);
            }
            goto LAB_00260e86;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38.nSatoshisPerK) goto LAB_00261605;
          std::__throw_bad_alloc();
          goto LAB_0026152b;
        }
      }
      local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sVar13 = 0;
      __dest = (pointer)0x0;
      local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pbVar15;
LAB_00260e86:
      local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + sVar13;
      std::vector<std::byte,_std::allocator<std::byte>_>::operator=(&file.m_xor,&local_208);
      if (local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      __fd = (int)(MempoolAcceptResult *)&mapDeltas;
      AutoFile::read(&file,__fd,&DAT_00000008,(size_t)__nbytes);
      total_txns_to_load = mapDeltas._M_t._M_impl._0_8_;
      txns_tried = 0;
      logging_function_00._M_str = "LoadMempool";
      logging_function_00._M_len = 0xb;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file_00._M_len = 0x68;
      LogPrintFormatInternal<unsigned_long>
                (logging_function_00,source_file_00,0x49,ALL,Info,
                 (ConstevalFormatString<1U>)0x7f12be,&total_txns_to_load);
      local_268 = 0;
      local_270 = 0;
      lVar18 = 0;
      local_260 = 0;
      iVar14 = 0;
LAB_00260f82:
      uVar7 = total_txns_to_load;
      uVar6 = txns_tried;
      if (txns_tried <= total_txns_to_load && total_txns_to_load - txns_tried != 0)
      goto code_r0x00260f98;
      p_Var1 = &mapDeltas._M_t._M_impl.super__Rb_tree_header;
      mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mapDeltas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      Unserialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
                (&file,&mapDeltas);
      p_Var10 = mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (((_Rb_tree_header *)mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var1 & opts->apply_fee_delta_priority) == 1) {
        do {
          CTxMemPool::PrioritiseTransaction(pool,(uint256 *)(p_Var10 + 1),(CAmount *)(p_Var10 + 2));
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var1);
      }
      p_Var1 = &unbroadcast_txids._M_t._M_impl.super__Rb_tree_header;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = 0;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = SUB81(p_Var1,0)
      ;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
           (undefined7)((ulong)p_Var1 >> 8);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
           unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_ =
           unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_;
      Unserialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
                (&file,&unbroadcast_txids);
      if (opts->apply_unbroadcast_set == true) {
        unbroadcast = unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count;
        for (p_Var11 = (_Rb_tree_node_base *)
                       CONCAT71(unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_left._1_7_,
                                unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_left._0_1_); (_Rb_tree_header *)p_Var11 != p_Var1;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          CTxMemPool::get((CTxMemPool *)&tx,(uint256 *)pool);
          peVar5 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (peVar5 != (element_type *)0x0) {
            CTxMemPool::AddUnbroadcastTx(pool,(uint256 *)(p_Var11 + 1));
          }
        }
      }
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&unbroadcast_txids._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::~_Rb_tree(&mapDeltas._M_t);
LAB_00261441:
      if (xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (uVar6 < uVar7) goto LAB_00261463;
      bVar8 = true;
      logging_function_02._M_str = "LoadMempool";
      logging_function_02._M_len = 0xb;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file_02._M_len = 0x68;
      LogPrintFormatInternal<long,long,long,long,long>
                (logging_function_02,source_file_02,0x91,ALL,Info,
                 (ConstevalFormatString<5U>)0x7f1380,&count,&failed,&expired,&already_there,
                 &unbroadcast);
      goto LAB_002614d7;
    }
    logging_function._M_str = "LoadMempool";
    logging_function._M_len = 0xb;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file._M_len = 0x68;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x2f,ALL,Info,(ConstevalFormatString<0U>)0x7f128d);
LAB_00261463:
    bVar8 = false;
LAB_002614d7:
    AutoFile::~AutoFile(&file);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38.nSatoshisPerK) {
    return bVar8;
  }
LAB_00261605:
  __stack_chk_fail();
code_r0x00260f98:
  auVar16._8_4_ = (int)(txns_tried >> 0x20);
  auVar16._0_8_ = txns_tried;
  auVar16._12_4_ = 0x45300000;
  auVar17._8_4_ = (int)(total_txns_to_load >> 0x20);
  auVar17._0_8_ = total_txns_to_load;
  auVar17._12_4_ = 0x45300000;
  percentage_done =
       (int)((((auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)txns_tried) - 4503599627370496.0)) * 100.0) /
            ((auVar17._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)total_txns_to_load) - 4503599627370496.0)));
  if (iVar14 < percentage_done / 10) {
    logging_function_01._M_str = "LoadMempool";
    logging_function_01._M_len = 0xb;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file_01._M_len = 0x68;
    mapDeltas._M_t._M_impl._0_8_ = total_txns_to_load - txns_tried;
    LogPrintFormatInternal<int,unsigned_long,unsigned_long>
              (logging_function_01,source_file_01,0x4f,ALL,Info,(ConstevalFormatString<3U>)0x7f12ec,
               &percentage_done,&txns_tried,(unsigned_long *)&mapDeltas);
    iVar14 = percentage_done / 10;
  }
  sVar13 = txns_tried + 1;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mapDeltas._M_t._M_impl._0_8_ = &::TX_WITH_WITNESS;
  txns_tried = sVar13;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &file;
  Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
            ((ParamsStream<AutoFile_&,_TransactionSerParams> *)&mapDeltas,&tx);
  AutoFile::read(&file,__fd,&DAT_00000008,sVar13);
  accept_time = mapDeltas._M_t._M_impl._0_8_;
  AutoFile::read(&file,__fd,&DAT_00000008,sVar13);
  if (opts->use_current_time != false) {
    accept_time = (long)tVar9.__d.__r / 1000000000;
  }
  amountdelta = mapDeltas._M_t._M_impl._0_8_;
  if ((mapDeltas._M_t._M_impl._0_8_ != 0) && (opts->apply_fee_delta_priority == true)) {
    CTxMemPool::PrioritiseTransaction
              (pool,&((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->hash).m_wrapped,&amountdelta);
  }
  if (((pool->m_opts).expiry.__r * -1000000000 + (long)tVar9.__d.__r) / 1000000000 < accept_time) {
    criticalblock7.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock7.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock7.super_unique_lock);
    AcceptToMemoryPool((MempoolAcceptResult *)&mapDeltas,active_chainstate,&tx,accept_time,false,
                       false);
    if (mapDeltas._M_t._M_impl._0_4_ == 0) {
      local_268 = local_268 + 1;
      count = local_268;
    }
    else {
      unbroadcast_txids._M_t._M_impl._0_1_ = 0;
      uVar12 = *(undefined8 *)
                ((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar2 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar3 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar4 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ =
           (undefined7)uVar3;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           (undefined1)((ulong)uVar3 >> 0x38);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
           (undefined7)uVar4;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
           (undefined1)((ulong)uVar4 >> 0x38);
      unbroadcast_txids._M_t._M_impl._1_7_ = SUB87(uVar12,0);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
           (undefined1)((ulong)uVar12 >> 0x38);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_3_ =
           (undefined3)uVar2;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           SUB84((ulong)uVar2 >> 0x18,0);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
           (undefined1)((ulong)uVar2 >> 0x38);
      bVar8 = CTxMemPool::exists(pool,(GenTxid *)&unbroadcast_txids);
      if (bVar8) {
        local_270 = local_270 + 1;
        already_there = local_270;
      }
      else {
        lVar18 = lVar18 + 1;
        failed = lVar18;
      }
    }
    if ((local_68 == true) &&
       (local_68 = false,
       local_80._M_value.
       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_80._M_value.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80._M_value.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - local_80._0_8_);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_p != &local_d8) {
      operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
    }
    if (mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
      operator_delete(mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                      (ulong)((long)&(mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_right)->_M_color + 1));
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  }
  else {
    local_260 = local_260 + 1;
    expired = local_260;
  }
  bVar8 = util::SignalInterrupt::operator_cast_to_bool(active_chainstate->m_chainman->m_interrupt);
  if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (bVar8) goto LAB_00261441;
  goto LAB_00260f82;
}

Assistant:

bool LoadMempool(CTxMemPool& pool, const fs::path& load_path, Chainstate& active_chainstate, ImportMempoolOptions&& opts)
{
    if (load_path.empty()) return false;

    AutoFile file{opts.mockable_fopen_function(load_path, "rb")};
    if (file.IsNull()) {
        LogInfo("Failed to open mempool file. Continuing anyway.\n");
        return false;
    }

    int64_t count = 0;
    int64_t expired = 0;
    int64_t failed = 0;
    int64_t already_there = 0;
    int64_t unbroadcast = 0;
    const auto now{NodeClock::now()};

    try {
        uint64_t version;
        file >> version;
        std::vector<std::byte> xor_key;
        if (version == MEMPOOL_DUMP_VERSION_NO_XOR_KEY) {
            // Leave XOR-key empty
        } else if (version == MEMPOOL_DUMP_VERSION) {
            file >> xor_key;
        } else {
            return false;
        }
        file.SetXor(xor_key);
        uint64_t total_txns_to_load;
        file >> total_txns_to_load;
        uint64_t txns_tried = 0;
        LogInfo("Loading %u mempool transactions from file...\n", total_txns_to_load);
        int next_tenth_to_report = 0;
        while (txns_tried < total_txns_to_load) {
            const int percentage_done(100.0 * txns_tried / total_txns_to_load);
            if (next_tenth_to_report < percentage_done / 10) {
                LogInfo("Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                        percentage_done, txns_tried, total_txns_to_load - txns_tried);
                next_tenth_to_report = percentage_done / 10;
            }
            ++txns_tried;

            CTransactionRef tx;
            int64_t nTime;
            int64_t nFeeDelta;
            file >> TX_WITH_WITNESS(tx);
            file >> nTime;
            file >> nFeeDelta;

            if (opts.use_current_time) {
                nTime = TicksSinceEpoch<std::chrono::seconds>(now);
            }

            CAmount amountdelta = nFeeDelta;
            if (amountdelta && opts.apply_fee_delta_priority) {
                pool.PrioritiseTransaction(tx->GetHash(), amountdelta);
            }
            if (nTime > TicksSinceEpoch<std::chrono::seconds>(now - pool.m_opts.expiry)) {
                LOCK(cs_main);
                const auto& accepted = AcceptToMemoryPool(active_chainstate, tx, nTime, /*bypass_limits=*/false, /*test_accept=*/false);
                if (accepted.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    ++count;
                } else {
                    // mempool may contain the transaction already, e.g. from
                    // wallet(s) having loaded it while we were processing
                    // mempool transactions; consider these as valid, instead of
                    // failed, but mark them as 'already there'
                    if (pool.exists(GenTxid::Txid(tx->GetHash()))) {
                        ++already_there;
                    } else {
                        ++failed;
                    }
                }
            } else {
                ++expired;
            }
            if (active_chainstate.m_chainman.m_interrupt)
                return false;
        }
        std::map<uint256, CAmount> mapDeltas;
        file >> mapDeltas;

        if (opts.apply_fee_delta_priority) {
            for (const auto& i : mapDeltas) {
                pool.PrioritiseTransaction(i.first, i.second);
            }
        }

        std::set<uint256> unbroadcast_txids;
        file >> unbroadcast_txids;
        if (opts.apply_unbroadcast_set) {
            unbroadcast = unbroadcast_txids.size();
            for (const auto& txid : unbroadcast_txids) {
                // Ensure transactions were accepted to mempool then add to
                // unbroadcast set.
                if (pool.get(txid) != nullptr) pool.AddUnbroadcastTx(txid);
            }
        }
    } catch (const std::exception& e) {
        LogInfo("Failed to deserialize mempool data on file: %s. Continuing anyway.\n", e.what());
        return false;
    }

    LogInfo("Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n", count, failed, expired, already_there, unbroadcast);
    return true;
}